

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

Value ** __thiscall
JsUtil::
BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Lookup(BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this,uint *key)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  uint uVar4;
  Value **ppVVar5;
  Type this_00;
  Type this_01;
  uint uVar6;
  
  piVar1 = (this->
           super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           ).buckets;
  uVar3 = 0;
  if (piVar1 != (Type)0x0) {
    uVar3 = BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetBucket(*key * 2 + 1,
                        (this->
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        ).bucketCount,
                        (this->
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        ).modFunctionIndex);
    uVar6 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar6) {
      pSVar2 = (this->
               super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ).entries;
      uVar3 = 0;
      do {
        this_01 = pSVar2 + uVar6;
        uVar4 = anon_unknown_5::ImplicitKeyValueEntry<unsigned_int,_Value_*>::Key
                          ((ImplicitKeyValueEntry<unsigned_int,_Value_*> *)this_01);
        if (uVar4 == *key) {
          this_00 = (this->
                    super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ).stats;
          goto LAB_00426589;
        }
        uVar3 = uVar3 + 1;
        uVar6 = (this_01->
                super_DefaultHashedEntry<unsigned_int,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                ).super_ImplicitKeyValueEntry<unsigned_int,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
                super_ValueEntryData<Value_*>.next;
      } while (-1 < (int)uVar6);
    }
  }
  this_00 = (this->
            super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ).stats;
  uVar6 = 0xffffffff;
LAB_00426589:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  if ((int)uVar6 < 0) {
    ppVVar5 = &Lookup::nullElement;
  }
  else {
    ppVVar5 = (Value **)
              ((this->
               super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ).entries + uVar6);
  }
  return ppVVar5;
}

Assistant:

TElement const& Lookup(TKey const& key)
        {
            // Use a static to pass the null default value, since the
            // default value may get returned out of the current scope by ref.
            static const TElement nullElement = nullptr;
            return __super::Lookup(key, nullElement);
        }